

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibTable.cpp
# Opt level: O1

int lib::table::Unpack(State *state)

{
  bool bVar1;
  int iVar2;
  Table *this;
  size_t sVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  Value VVar7;
  StackAPI api;
  StackAPI local_60;
  anon_union_8_9_8deb4486_for_Value_0 local_50;
  undefined4 local_48;
  anon_union_8_9_8deb4486_for_Value_0 local_40;
  ValueT local_38;
  
  luna::StackAPI::StackAPI(&local_60,state);
  iVar5 = 1;
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT,luna::ValueT,luna::ValueT>
                    (&local_60,1,ValueT_Table,ValueT_Number,ValueT_Number);
  iVar2 = 0;
  if (bVar1) {
    iVar2 = luna::StackAPI::GetStackSize(&local_60);
    this = luna::StackAPI::GetTable(&local_60,0);
    sVar3 = luna::Table::ArraySize(this);
    iVar4 = (int)sVar3;
    if (1 < iVar2) {
      dVar6 = luna::StackAPI::GetNumber(&local_60,1);
      iVar5 = (int)dVar6;
    }
    if (2 < iVar2) {
      dVar6 = luna::StackAPI::GetNumber(&local_60,2);
      iVar4 = (int)dVar6;
    }
    local_48 = 2;
    iVar2 = 0;
    if (iVar5 <= iVar4) {
      iVar2 = iVar5;
      do {
        local_50.num_ = (double)iVar2;
        VVar7 = luna::Table::GetValue(this,(Value *)&local_50);
        local_40 = VVar7.field_0;
        local_38 = VVar7.type_;
        luna::StackAPI::PushValue(&local_60,(Value *)&local_40);
        iVar2 = iVar2 + 1;
      } while (iVar4 + 1 != iVar2);
      iVar2 = (iVar4 + 1) - iVar5;
    }
  }
  return iVar2;
}

Assistant:

int Unpack(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(1, luna::ValueT_Table,
                           luna::ValueT_Number, luna::ValueT_Number))
            return 0;

        auto params = api.GetStackSize();
        auto table = api.GetTable(0);

        int begin = 1;
        int end = table->ArraySize();
        if (params > 1)
            begin = static_cast<int>(api.GetNumber(1));
        if (params > 2)
            end = static_cast<int>(api.GetNumber(2));

        int count = 0;
        luna::Value key;
        key.type_ = luna::ValueT_Number;
        for (int i = begin; i <= end; ++i)
        {
            key.num_ = i;
            api.PushValue(table->GetValue(key));
            ++count;
        }

        return count;
    }